

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

drwav_int16 *
drwav__read_pcm_frames_and_close_s16
          (drwav *pWav,uint *channels,uint *sampleRate,drwav_uint64 *totalFrameCount)

{
  drwav *pWav_00;
  void *p;
  undefined8 *in_RCX;
  undefined4 *in_RDX;
  uint *in_RSI;
  long in_RDI;
  drwav_uint64 framesRead;
  drwav_int16 *pSampleData;
  drwav_uint64 sampleDataSize;
  drwav_allocation_callbacks *in_stack_ffffffffffffffb8;
  drwav_uint64 in_stack_ffffffffffffffc0;
  drwav *in_stack_fffffffffffffff8;
  
  if (in_RDI != 0) {
    pWav_00 = (drwav *)drwav__malloc_from_callbacks
                                 ((size_t)in_stack_ffffffffffffffb8,
                                  (drwav_allocation_callbacks *)0x1696a2);
    if (pWav_00 == (drwav *)0x0) {
      drwav_uninit(in_stack_fffffffffffffff8);
      pWav_00 = (drwav *)0x0;
    }
    else {
      p = (void *)drwav_read_pcm_frames_s16
                            (pWav_00,in_stack_ffffffffffffffc0,
                             (drwav_int16 *)in_stack_ffffffffffffffb8);
      if (p == *(void **)(in_RDI + 0x78)) {
        drwav_uninit(in_stack_fffffffffffffff8);
        if (in_RDX != (undefined4 *)0x0) {
          *in_RDX = *(undefined4 *)(in_RDI + 0x6c);
        }
        if (in_RSI != (uint *)0x0) {
          *in_RSI = (uint)*(ushort *)(in_RDI + 0x70);
        }
        if (in_RCX != (undefined8 *)0x0) {
          *in_RCX = *(undefined8 *)(in_RDI + 0x78);
        }
      }
      else {
        drwav__free_from_callbacks(p,in_stack_ffffffffffffffb8);
        drwav_uninit(in_stack_fffffffffffffff8);
        pWav_00 = (drwav *)0x0;
      }
    }
    return (drwav_int16 *)pWav_00;
  }
  __assert_fail("pWav != __null",
                "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/dr_wav.h",
                0x153c,
                "drwav_int16 *drwav__read_pcm_frames_and_close_s16(drwav *, unsigned int *, unsigned int *, drwav_uint64 *)"
               );
}

Assistant:

static drwav_int16* drwav__read_pcm_frames_and_close_s16(drwav* pWav, unsigned int* channels, unsigned int* sampleRate, drwav_uint64* totalFrameCount)
{
    drwav_uint64 sampleDataSize;
    drwav_int16* pSampleData;
    drwav_uint64 framesRead;

    DRWAV_ASSERT(pWav != NULL);

    sampleDataSize = pWav->totalPCMFrameCount * pWav->channels * sizeof(drwav_int16);
    if (sampleDataSize > DRWAV_SIZE_MAX) {
        drwav_uninit(pWav);
        return NULL;    /* File's too big. */
    }

    pSampleData = (drwav_int16*)drwav__malloc_from_callbacks((size_t)sampleDataSize, &pWav->allocationCallbacks); /* <-- Safe cast due to the check above. */
    if (pSampleData == NULL) {
        drwav_uninit(pWav);
        return NULL;    /* Failed to allocate memory. */
    }

    framesRead = drwav_read_pcm_frames_s16(pWav, (size_t)pWav->totalPCMFrameCount, pSampleData);
    if (framesRead != pWav->totalPCMFrameCount) {
        drwav__free_from_callbacks(pSampleData, &pWav->allocationCallbacks);
        drwav_uninit(pWav);
        return NULL;    /* There was an error reading the samples. */
    }

    drwav_uninit(pWav);

    if (sampleRate) {
        *sampleRate = pWav->sampleRate;
    }
    if (channels) {
        *channels = pWav->channels;
    }
    if (totalFrameCount) {
        *totalFrameCount = pWav->totalPCMFrameCount;
    }

    return pSampleData;
}